

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall
CProficiencies::GetProfsTaughtByTrainer(CProficiencies *this,char_data *ch,char_data *trainer)

{
  long lVar1;
  ulong uVar2;
  int *args_1;
  long lVar3;
  string_view fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  
  if (ch == (char_data *)0x0) {
    fmt._M_str = "CProficiencies::GetProfsTaughtByTrainer: Charater is null.";
    fmt._M_len = 0x3a;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (trainer != (char_data *)0x0) {
    args_1 = (int *)0x3;
    act("You may learn the following proficiencies from $N:",ch,(void *)0x0,trainer,3);
    lVar1 = (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    for (uVar2 = 0; uVar2 != lVar1 / 0x28; uVar2 = uVar2 + 1) {
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        if (uVar2 == (uint)(int)trainer->pIndexData->profs_taught[lVar3]) {
          ::fmt::v9::sprintf<char[20],char*,int,char>
                    (&buffer,(v9 *)"%-16s | %d points\n\r",
                     (char (*) [20])
                     &prof_table.
                      super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar2].name,
                     (char **)&prof_table.
                               super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar2].cost,args_1);
          send_to_char(buffer._M_dataplus._M_p,ch);
          std::__cxx11::string::~string((string *)&buffer);
        }
      }
    }
    return;
  }
  send_to_char("Invalid trainer",ch);
  return;
}

Assistant:

void CProficiencies::GetProfsTaughtByTrainer(char_data* ch, char_data* trainer)
{
	if (ch == nullptr)
	{
		RS.Logger.Debug("CProficiencies::GetProfsTaughtByTrainer: Charater is null.");
		return;
	}
	
	if (trainer == nullptr)
	{
		send_to_char("Invalid trainer", ch);
		return;
	}

	act("You may learn the following proficiencies from $N:", ch, 0, trainer, TO_CHAR);

	auto prof_table_size = std::size(prof_table);
	auto profs_taught_size = std::size(trainer->pIndexData->profs_taught);
	for (auto i = 0; i < prof_table_size; i++)
	{
		for (auto j = 0; j < profs_taught_size; j++)
		{
			if (trainer->pIndexData->profs_taught[j] == i)
			{
				auto buffer = fmt::sprintf("%-16s | %d points\n\r", prof_table[i].name, prof_table[i].cost);
				send_to_char(buffer.c_str(), ch);
			}
		}
	}
}